

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

DWORD __thiscall TBitEntryArray::GetItem(TBitEntryArray *this,DWORD EntryIndex)

{
  sbyte sVar1;
  uint uVar2;
  uint uVar3;
  uint local_24;
  DWORD dwResult;
  DWORD dwEndBit;
  DWORD dwStartBit;
  DWORD dwItemIndex;
  DWORD EntryIndex_local;
  TBitEntryArray *this_local;
  
  uVar2 = EntryIndex * *(int *)&(this->super_TGenericArray<unsigned_int>).field_0x14 >> 5;
  uVar3 = EntryIndex * *(int *)&(this->super_TGenericArray<unsigned_int>).field_0x14 & 0x1f;
  sVar1 = (sbyte)uVar3;
  if (uVar3 + *(int *)&(this->super_TGenericArray<unsigned_int>).field_0x14 < 0x21) {
    local_24 = (this->super_TGenericArray<unsigned_int>).ItemArray[uVar2] >> sVar1;
  }
  else {
    local_24 = (this->super_TGenericArray<unsigned_int>).ItemArray[uVar2 + 1] <<
               (0x20U - sVar1 & 0x1f) |
               (this->super_TGenericArray<unsigned_int>).ItemArray[uVar2] >> sVar1;
  }
  return local_24 & this->EntryBitMask;
}

Assistant:

DWORD GetItem(DWORD EntryIndex)
    {
        DWORD dwItemIndex = (EntryIndex * BitsPerEntry) >> 0x05;
        DWORD dwStartBit = (EntryIndex * BitsPerEntry) & 0x1F;
        DWORD dwEndBit = dwStartBit + BitsPerEntry;
        DWORD dwResult;

        // If the end bit index is greater than 32,
        // we also need to load from the next 32-bit item
        if(dwEndBit > 0x20)
        {
            dwResult = (ItemArray[dwItemIndex + 1] << (0x20 - dwStartBit)) | (ItemArray[dwItemIndex] >> dwStartBit);
        }
        else
        {
            dwResult = ItemArray[dwItemIndex] >> dwStartBit;
        }

        // Now we also need to mask the result by the bit mask
        return dwResult & EntryBitMask;
    }